

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall duckdb::Serializer::WriteValue<duckdb::QueryNode>(Serializer *this,QueryNode *ptr)

{
  Serializer *in_RSI;
  QueryNode *in_RDI;
  
  if (in_RSI == (Serializer *)0x0) {
    (*in_RDI->_vptr_QueryNode[10])(in_RDI,0);
    (*in_RDI->_vptr_QueryNode[0xb])();
  }
  else {
    (*in_RDI->_vptr_QueryNode[10])(in_RDI,1);
    WriteValue<duckdb::QueryNode>(in_RSI,in_RDI);
    (*in_RDI->_vptr_QueryNode[0xb])();
  }
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}